

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::read<(moira::Core)0,(moira::AddrSpace)1,4,0ull>(Moira *this,u32 addr)

{
  StackFrame frame;
  bool bVar1;
  u32 uVar2;
  int iVar3;
  uint uVar4;
  u32 uVar5;
  AddressError *this_00;
  StackFrame local_30;
  uint local_18;
  u32 local_14;
  u32 result;
  u32 addr_local;
  Moira *this_local;
  
  local_14 = addr;
  _result = this;
  setFC(this,'\x01');
  bVar1 = misaligned<(moira::Core)0,4>(this,local_14);
  if (bVar1) {
    this_00 = (AddressError *)__cxa_allocate_exception(0x20);
    makeFrame<0ull>(&local_30,this,local_14);
    frame.ird = local_30.ird;
    frame.sr = local_30.sr;
    frame.pc = local_30.pc;
    frame.code = local_30.code;
    frame._2_2_ = local_30._2_2_;
    frame.addr = local_30.addr;
    frame.fc = local_30.fc;
    frame.ssw = local_30.ssw;
    AddressError::AddressError(this_00,frame);
    __cxa_throw(this_00,&AddressError::typeinfo,AddressError::~AddressError);
  }
  if (((this->flags & 0x100U) != 0) &&
     (bVar1 = Debugger::watchpointMatches(&this->debugger,local_14,4), bVar1)) {
    (*this->_vptr_Moira[0x16])(this,(ulong)local_14);
  }
  uVar5 = local_14;
  uVar2 = addrMask<(moira::Core)0>(this);
  iVar3 = (*this->_vptr_Moira[4])(this,(ulong)(uVar5 & uVar2));
  local_18 = iVar3 << 0x10;
  uVar4 = local_14 + 2;
  uVar5 = addrMask<(moira::Core)0>(this);
  uVar4 = (*this->_vptr_Moira[4])(this,(ulong)(uVar4 & uVar5));
  return uVar4 & 0xffff | local_18;
}

Assistant:

u32
Moira::read(u32 addr)
{
    u32 result;

    // Update function code pins
    setFC(AS == AddrSpace::DATA ? FC::USER_DATA : FC::USER_PROG);
    SYNC(2);

    // Check for address errors
    if (misaligned<C, S>(addr)) {
        throw AddressError(makeFrame<F>(addr));
    }

    // Check if a watchpoint has been reached
    if ((flags & State::CHECK_WP) && debugger.watchpointMatches(addr, S)) {
        didReachWatchpoint(addr);
    }

    if constexpr (S == Byte) {

        if (F & POLL) POLL_IPL;
        result = read8(addr & addrMask<C>());
        SYNC(2);
    }

    if constexpr (S == Word) {

        if (F & POLL) POLL_IPL;
        result = read16(addr & addrMask<C>());
        SYNC(2);
    }

    if constexpr (S == Long) {

        result = read16(addr & addrMask<C>()) << 16;
        SYNC(4);
        if (F & POLL) POLL_IPL;
        result |= read16((addr + 2) & addrMask<C>());
        SYNC(2);
    }

    return result;
}